

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O3

vertex_iterator __thiscall
xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::ObtainVertexFromVertexMap
          (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *this,SquareCell state)

{
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  _Var1;
  VertexMapType *this_00;
  int64_t state_id;
  int64_t local_28;
  int64_t local_20;
  int64_t *local_18;
  
  local_28 = state.id;
  this_00 = &this->vertex_map_;
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<long,_std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&this_00->_M_h,&local_28);
  if (_Var1._M_cur == (__node_type *)0x0) {
    local_18 = (int64_t *)operator_new(0x80);
    *local_18 = state.idx.x;
    local_18[1] = state.idx.y;
    local_18[2] = state.id;
    local_18[3] = local_28;
    local_18[6] = (int64_t)(local_18 + 5);
    local_18[5] = (int64_t)(local_18 + 5);
    local_18[7] = 0;
    local_18[9] = (int64_t)(local_18 + 8);
    local_18[8] = (int64_t)(local_18 + 8);
    local_18[10] = 0;
    *(undefined2 *)(local_18 + 0xb) = 0;
    *(undefined4 *)(local_18 + 0xc) = 0xffffffff;
    *(undefined4 *)((long)local_18 + 100) = 0x7fefffff;
    *(undefined4 *)(local_18 + 0xd) = 0xffffffff;
    *(undefined4 *)((long)local_18 + 0x6c) = 0x7fefffff;
    local_18[0xe] = 0x7fefffffffffffff;
    local_18[0xf] = 0;
    local_20 = local_28;
    std::
    _Hashtable<long,std::pair<long_const,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<long,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*>>
              ((_Hashtable<long,std::pair<long_const,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this_00);
    _Var1._M_cur = (__node_type *)
                   std::
                   _Hashtable<long,_std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&this_00->_M_h,&local_28);
  }
  return (vertex_iterator)_Var1._M_cur;
}

Assistant:

typename Graph<State, Transition, StateIndexer>::vertex_iterator
Graph<State, Transition, StateIndexer>::ObtainVertexFromVertexMap(State state) {
  int64_t state_id = GetStateIndex(state);
  auto it = vertex_map_.find(state_id);

  if (it == vertex_map_.end()) {
    auto new_vertex = new Vertex(state, state_id);
    new_vertex->search_parent = vertex_end();
    vertex_map_.insert(std::make_pair(state_id, new_vertex));
    return vertex_iterator(vertex_map_.find(state_id));
  }

  return vertex_iterator(it);
}